

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool set_location_window_from_val
               (Am_Object *locgen_window,Am_Inter_Location *current_val,Am_Value *old_val)

{
  Am_Inter_Location *this;
  bool value;
  ostream *this_00;
  Am_Wrapper *value_00;
  bool bVar1;
  Am_Object local_348;
  Am_Object local_340;
  Am_Object local_338;
  Am_Object local_330;
  Am_Object local_328;
  Am_Object local_320;
  Am_Object local_318;
  Am_Object local_310;
  Am_Object local_308;
  Am_Object local_300;
  Am_Object local_2f8;
  Am_Object local_2f0;
  Am_Object local_2e8;
  Am_Object local_2e0;
  Am_Object local_2d8;
  am_loc_values *local_2d0;
  am_loc_values *loc_values;
  ostrstream local_2c0 [8];
  ostrstream oss;
  char local_158 [8];
  char line [250];
  bool growing;
  Am_Object local_48;
  Am_Object ref_obj;
  int local_38;
  int d;
  int c;
  int b;
  int a;
  bool as_line;
  Am_Value *old_val_local;
  Am_Inter_Location *current_val_local;
  Am_Object *locgen_window_local;
  
  _a = old_val;
  old_val_local = (Am_Value *)current_val;
  current_val_local = (Am_Inter_Location *)locgen_window;
  Am_Object::Am_Object(&local_48);
  Am_Inter_Location::Get_Location
            ((Am_Inter_Location *)old_val_local,(bool *)((long)&b + 3),&local_48,&c,&d,&local_38,
             (int *)((long)&ref_obj.data + 4));
  value = Am_Inter_Location::Get_Growing((Am_Inter_Location *)old_val_local);
  bVar1 = (b._3_1_ & 1) == 0;
  if (bVar1) {
    local_2d0 = create_loc_values((Am_Inter_Location *)old_val_local,_a);
    Am_Object::Set((Am_Object *)current_val_local,0xfa,local_2d0,0);
    Am_Object::Get_Object(&local_2d8,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_LEFT);
    Am_Object::Set(&local_2d8,0x169,true,0);
    Am_Object::~Am_Object(&local_2d8);
    Am_Object::Get_Object(&local_2e0,(Am_Slot_Key)current_val_local,(ulong)Am_LEFT_HOW);
    Am_Object::Set(&local_2e0,0x169,10,0);
    Am_Object::~Am_Object(&local_2e0);
    Am_Object::Get_Object(&local_2e8,(Am_Slot_Key)current_val_local,(ulong)Am_LEFT_AMOUNT_WIDGET);
    Am_Object::Set(&local_2e8,0x169,c,0);
    Am_Object::~Am_Object(&local_2e8);
    Am_Object::Get_Object(&local_2f0,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_TOP);
    Am_Object::Set(&local_2f0,0x169,true,0);
    Am_Object::~Am_Object(&local_2f0);
    Am_Object::Get_Object(&local_2f8,(Am_Slot_Key)current_val_local,(ulong)Am_TOP_HOW);
    Am_Object::Set(&local_2f8,0x169,10,0);
    Am_Object::~Am_Object(&local_2f8);
    Am_Object::Get_Object(&local_300,(Am_Slot_Key)current_val_local,(ulong)Am_TOP_AMOUNT_WIDGET);
    Am_Object::Set(&local_300,0x169,d,0);
    Am_Object::~Am_Object(&local_300);
    Am_Object::Get_Object(&local_308,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set(&local_308,0xcc,value,0);
    Am_Object::~Am_Object(&local_308);
    Am_Object::Get_Object(&local_310,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set(&local_310,0x169,value,0);
    Am_Object::~Am_Object(&local_310);
    Am_Object::Get_Object(&local_318,(Am_Slot_Key)current_val_local,(ulong)Am_WIDTH_HOW);
    Am_Object::Set(&local_318,0x169,10,0);
    Am_Object::~Am_Object(&local_318);
    Am_Object::Get_Object(&local_320,(Am_Slot_Key)current_val_local,(ulong)Am_WIDTH_AMOUNT_WIDGET);
    Am_Object::Set(&local_320,0x169,local_38,0);
    Am_Object::~Am_Object(&local_320);
    Am_Object::Get_Object(&local_328,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set(&local_328,0xcc,value,0);
    Am_Object::~Am_Object(&local_328);
    Am_Object::Get_Object(&local_330,(Am_Slot_Key)current_val_local,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set(&local_330,0x169,value,0);
    Am_Object::~Am_Object(&local_330);
    Am_Object::Get_Object(&local_338,(Am_Slot_Key)current_val_local,(ulong)Am_HEIGHT_HOW);
    Am_Object::Set(&local_338,0x169,10,0);
    Am_Object::~Am_Object(&local_338);
    Am_Object::Get_Object(&local_340,(Am_Slot_Key)current_val_local,(ulong)Am_HEIGHT_AMOUNT_WIDGET);
    Am_Object::Set(&local_340,0x169,ref_obj.data._4_4_,0);
    Am_Object::~Am_Object(&local_340);
    Am_Object::Get_Object
              (&local_348,(Am_Slot_Key)current_val_local,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
    Am_Object::Set(&local_348,0x169,"",0);
    Am_Object::~Am_Object(&local_348);
    this = current_val_local;
    value_00 = Am_Inter_Location::operator_cast_to_Am_Wrapper_((Am_Inter_Location *)old_val_local);
    Am_Object::Set((Am_Object *)this,0x169,value_00,0);
  }
  else {
    std::ostrstream::ostrstream(local_2c0,local_158,0xfa,_S_out);
    this_00 = std::operator<<((ostream *)local_2c0,
                              "Not yet implemented to generalize when as a line");
    std::ostream::operator<<(this_00,std::ends<char,std::char_traits<char>>);
    Am_Pop_Up_Error_Window(local_158);
    std::ostrstream::~ostrstream(local_2c0);
  }
  loc_values._4_4_ = 1;
  locgen_window_local._7_1_ = bVar1;
  Am_Object::~Am_Object(&local_48);
  return (bool)(locgen_window_local._7_1_ & 1);
}

Assistant:

bool
set_location_window_from_val(Am_Object &locgen_window,
                             Am_Inter_Location &current_val, Am_Value &old_val)
{
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_val.Get_Location(as_line, ref_obj, a, b, c, d);
  bool growing = current_val.Get_Growing();
  if (as_line) {
    AM_POP_UP_ERROR_WINDOW("Not yet implemented to generalize when as a line");
    return false;
  }

  am_loc_values *loc_values = create_loc_values(current_val, old_val);
  locgen_window.Set(Am_VALUES, (Am_Ptr)loc_values);

  locgen_window.Get_Object(Am_CHANGE_LEFT).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_LEFT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, a);

  locgen_window.Get_Object(Am_CHANGE_TOP).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_TOP_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, b);

  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_WIDTH_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_WIDTH_AMOUNT_WIDGET).Set(Am_VALUE, c);

  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_HEIGHT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_HEIGHT_AMOUNT_WIDGET).Set(Am_VALUE, d);

  locgen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Set(Am_VALUE, "");

  locgen_window.Set(Am_VALUE, current_val);

  return true;
}